

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextbrowser.cpp
# Opt level: O1

void __thiscall
QTextBrowserPrivate::setSource(QTextBrowserPrivate *this,QUrl *url,ResourceType type)

{
  QUrl *pQVar1;
  QWidget *w;
  QUrlPrivate *pQVar2;
  int *piVar3;
  storage_type_conflict *psVar4;
  bool bVar5;
  Data *pDVar6;
  char16_t *pcVar7;
  qsizetype qVar8;
  Data *pDVar9;
  QArrayData *pQVar10;
  char cVar11;
  byte bVar12;
  int iVar13;
  qsizetype qVar14;
  long lVar15;
  undefined8 uVar16;
  QTextDocument *pQVar17;
  ulong uVar18;
  longlong lVar19;
  QDebug QVar20;
  long in_FS_OFFSET;
  QLatin1String QVar21;
  QLatin1String QVar22;
  QLatin1String QVar23;
  QByteArrayView QVar24;
  QByteArrayView QVar25;
  QStringView QVar26;
  QStringView QVar27;
  QStringView QVar28;
  QByteArrayView QVar29;
  QByteArrayView QVar30;
  QByteArrayView QVar31;
  QByteArrayView QVar32;
  QByteArrayView in;
  QLatin1String QVar33;
  QLatin1String QVar34;
  QLatin1String QVar35;
  QUrl newUrlWithoutFragment;
  QUrl currentUrlWithoutFragment;
  QUrl baseUrl;
  QUrl local_180;
  QDebug local_178;
  QUrl local_170;
  QDebug local_168;
  QUrl local_160;
  QDebug local_158;
  QDebug local_150;
  QDebug local_148;
  storage_type *psStack_140;
  storage_type *local_138;
  undefined4 local_128;
  undefined4 uStack_124;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  undefined1 *local_118;
  QUrl local_108;
  QUrl local_100;
  QString local_f8;
  QString local_d8;
  undefined1 *local_c0;
  undefined1 *puStack_b8;
  undefined1 *local_b0;
  ClearDataFn p_Stack_a8;
  undefined1 local_98 [4];
  Representation RStack_94;
  undefined8 uStack_90;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined1 *puStack_80;
  anon_union_16_2_cfafc8b3_for_State_4 local_78;
  ClearDataFn local_68;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  w = *(QWidget **)
       &(this->super_QTextEditPrivate).super_QAbstractScrollAreaPrivate.super_QFramePrivate.
        super_QWidgetPrivate.field_0x8;
  if ((w->data->widget_attributes & 0x8000) != 0) {
    QCursor::QCursor((QCursor *)local_98,WaitCursor);
    QGuiApplication::setOverrideCursor((QCursor *)local_98);
    QCursor::~QCursor((QCursor *)local_98);
  }
  this->textOrSourceChanged = true;
  local_f8.d.d = (Data *)0x0;
  local_f8.d.ptr = (storage_type_conflict *)0x0;
  local_f8.d.size = 0;
  local_100.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar1 = &this->currentURL;
  QUrl::QUrl(&local_100,pQVar1);
  local_88 = 0;
  uStack_84 = 0;
  local_98 = (undefined1  [4])0x0;
  RStack_94.m_i = 0;
  uStack_90._0_4_ = 0;
  uStack_90._4_4_ = 0;
  QUrl::setFragment((QString *)&local_100,(ParsingMode)local_98);
  piVar3 = (int *)CONCAT44(RStack_94.m_i,local_98);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(RStack_94.m_i,local_98),2,0x10);
    }
  }
  local_108.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QUrl::resolved(&local_108);
  local_98 = (undefined1  [4])0x0;
  RStack_94.m_i = 0;
  uStack_90._0_4_ = 0;
  uStack_90._4_4_ = 0;
  local_88 = 0;
  uStack_84 = 0;
  QUrl::setFragment((QString *)&local_108,(ParsingMode)local_98);
  piVar3 = (int *)CONCAT44(RStack_94.m_i,local_98);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(RStack_94.m_i,local_98),2,0x10);
    }
  }
  local_118 = &DAT_aaaaaaaaaaaaaaaa;
  local_128 = 0xaaaaaaaa;
  uStack_124 = 0xaaaaaaaa;
  uStack_120 = 0xaaaaaaaa;
  uStack_11c = 0xaaaaaaaa;
  QUrl::fileName(&local_128,url,0x7f00000);
  if (type == UnknownResource) {
    QVar21.m_data = (char *)0x3;
    QVar21.m_size = (qsizetype)&local_128;
    cVar11 = QString::endsWith(QVar21,0x6f0199);
    type = MarkdownResource;
    if (cVar11 == '\0') {
      QVar22.m_data = (char *)0x4;
      QVar22.m_size = (qsizetype)&local_128;
      cVar11 = QString::endsWith(QVar22,0x6f019d);
      if (cVar11 == '\0') {
        QVar23.m_data = (char *)0x9;
        QVar23.m_size = (qsizetype)&local_128;
        bVar12 = QString::endsWith(QVar23,0x6f01a2);
        type = (uint)bVar12 + (uint)bVar12 * 2 + HtmlResource;
      }
    }
  }
  this->currentType = type;
  cVar11 = QUrl::isValid();
  if (cVar11 == '\0') {
LAB_004ade8e:
    bVar5 = false;
  }
  else {
    cVar11 = comparesEqual(&local_108,&local_100);
    if ((cVar11 != '\0') && (this->forceLoadOnSourceChange != true)) goto LAB_004ade8e;
    local_58._16_4_ = 0xaaaaaaaa;
    local_58._20_4_ = 0xaaaaaaaa;
    uStack_40 = 0xaaaaaaaa;
    uStack_3c = 0xaaaaaaaa;
    local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_58._8_4_ = 0xaaaaaaaa;
    local_58._12_4_ = 0xaaaaaaaa;
    (**(code **)(*(long *)&(this->super_QTextEditPrivate).super_QAbstractScrollAreaPrivate.
                           super_QFramePrivate.super_QWidgetPrivate + 0xc0))
              ((QUrl *)local_98,this,url);
    (**(code **)(*(long *)w + 0x1c8))(&local_58,w,type,(QUrl *)local_98);
    QUrl::~QUrl((QUrl *)local_98);
    iVar13 = ::QVariant::typeId((QVariant *)&local_58);
    if (iVar13 == 10) {
      ::QVariant::toString();
      pQVar10 = (QArrayData *)CONCAT44(RStack_94.m_i,local_98);
      psVar4 = (storage_type_conflict *)CONCAT44(uStack_90._4_4_,uStack_90._0_4_);
      local_98 = SUB84(local_f8.d.d,0);
      RStack_94.m_i = (int)((ulong)local_f8.d.d >> 0x20);
      uVar18 = CONCAT44(uStack_84,local_88);
      uStack_90._0_4_ = (Int)local_f8.d.ptr;
      uStack_90._4_4_ = (int)((ulong)local_f8.d.ptr >> 0x20);
      local_88 = (undefined4)local_f8.d.size;
      uStack_84 = (undefined4)((ulong)local_f8.d.size >> 0x20);
      local_f8.d.ptr = psVar4;
      local_f8.d.size = uVar18;
      if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          lVar19 = 2;
          QVar20.stream = (Stream *)local_f8.d.d;
          local_f8.d.d = (Data *)pQVar10;
LAB_004ae08e:
          QArrayData::deallocate((QArrayData *)QVar20.stream,lVar19,0x10);
          pQVar10 = &(local_f8.d.d)->super_QArrayData;
        }
      }
    }
    else {
      iVar13 = ::QVariant::typeId((QVariant *)&local_58);
      pQVar10 = &(local_f8.d.d)->super_QArrayData;
      if (iVar13 == 0xc) {
        local_138 = &DAT_aaaaaaaaaaaaaaaa;
        local_148.stream = (Stream *)&DAT_aaaaaaaaaaaaaaaa;
        psStack_140 = &DAT_aaaaaaaaaaaaaaaa;
        ::QVariant::toByteArray();
        if (type == HtmlResource) {
          local_68 = (ClearDataFn)&DAT_aaaaaaaaaaaaaaaa;
          local_78.d[0] = &DAT_aaaaaaaaaaaaaaaa;
          local_78.d[1] = &DAT_aaaaaaaaaaaaaaaa;
          local_88 = 0xaaaaaaaa;
          uStack_84 = 0xaaaaaaaa;
          puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
          local_98 = (undefined1  [4])0xaaaaaaaa;
          RStack_94.m_i = -0x55555556;
          uStack_90._0_4_ = -0x55555556;
          uStack_90._4_4_ = -0x55555556;
          QVar24.m_data = local_138;
          QVar24.m_size = (qsizetype)local_98;
          QStringDecoder::decoderForHtml(QVar24);
          if (CONCAT44(RStack_94.m_i,local_98) == 0) {
            local_d8.d.d = (Data *)&QStringConverter::encodingInterfaces;
            local_d8.d.ptr = (storage_type_conflict *)0x0;
            local_d8.d.size = 0;
            local_c0 = (undefined1 *)0x0;
            puStack_b8 = (undefined1 *)0x0;
            local_b0 = (undefined1 *)0x0;
            p_Stack_a8 = (ClearDataFn)0x0;
            local_98 = (undefined1  [4])0x841f90;
            RStack_94.m_i = 0;
            QStringConverterBase::State::clear();
            uStack_90._0_4_ = (Int)local_d8.d.ptr;
            local_88 = (undefined4)local_d8.d.size;
            uStack_84 = (undefined4)((ulong)local_d8.d.size >> 0x20);
            puStack_80 = local_c0;
            local_78.d[0] = puStack_b8;
            local_78.d[1] = local_b0;
            local_68 = p_Stack_a8;
            p_Stack_a8 = (ClearDataFn)0x0;
            QStringConverterBase::State::clear();
          }
          in.m_data = psStack_140;
          in.m_size = (qsizetype)local_138;
          QStringDecoder::decodeAsString(&local_d8,(QStringDecoder *)local_98,in);
          qVar8 = local_d8.d.size;
          pDVar9 = local_d8.d.d;
          pcVar7 = local_f8.d.ptr;
          pDVar6 = local_f8.d.d;
          local_d8.d.d = local_f8.d.d;
          local_f8.d.d = pDVar9;
          local_f8.d.ptr = local_d8.d.ptr;
          local_d8.d.ptr = pcVar7;
          local_d8.d.size = local_f8.d.size;
          local_f8.d.size = qVar8;
          if (&pDVar6->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&pDVar6->super_QArrayData,2,0x10);
            }
          }
          QStringConverterBase::State::clear();
          pQVar10 = &(local_f8.d.d)->super_QArrayData;
        }
        else {
          QVar25.m_data = local_138;
          QVar25.m_size = (qsizetype)local_98;
          QString::fromUtf8(QVar25);
          pDVar6 = local_f8.d.d;
          pQVar10 = (QArrayData *)CONCAT44(RStack_94.m_i,local_98);
          psVar4 = (storage_type_conflict *)CONCAT44(uStack_90._4_4_,uStack_90._0_4_);
          local_98 = SUB84(local_f8.d.d,0);
          RStack_94.m_i = (int)((ulong)local_f8.d.d >> 0x20);
          uVar18 = CONCAT44(uStack_84,local_88);
          uStack_90._0_4_ = (Int)local_f8.d.ptr;
          uStack_90._4_4_ = (int)((ulong)local_f8.d.ptr >> 0x20);
          local_88 = (undefined4)local_f8.d.size;
          uStack_84 = (undefined4)((ulong)local_f8.d.size >> 0x20);
          local_f8.d.ptr = psVar4;
          local_f8.d.size = uVar18;
          if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              local_f8.d.d = (Data *)pQVar10;
              QArrayData::deallocate(&pDVar6->super_QArrayData,2,0x10);
              pQVar10 = &(local_f8.d.d)->super_QArrayData;
            }
          }
        }
        local_f8.d.d = (Data *)pQVar10;
        pQVar10 = &(local_f8.d.d)->super_QArrayData;
        if ((QArrayData *)local_148.stream != (QArrayData *)0x0) {
          LOCK();
          *(int *)local_148.stream = *(int *)local_148.stream + -1;
          UNLOCK();
          if (*(int *)local_148.stream == 0) {
            lVar19 = 1;
            QVar20.stream = local_148.stream;
            goto LAB_004ae08e;
          }
        }
      }
    }
    local_f8.d.d = (Data *)pQVar10;
    if (local_f8.d.size == 0) {
      setSource((QTextBrowserPrivate *)url);
    }
    qVar8 = local_f8.d.size;
    pcVar7 = local_f8.d.ptr;
    if ((w->data->widget_attributes & 0x8000) == 0) {
LAB_004ae191:
      (**(code **)(*(long *)&(this->super_QTextEditPrivate).super_QAbstractScrollAreaPrivate.
                             super_QFramePrivate.super_QWidgetPrivate + 0xc0))
                ((QUrl *)local_98,this,url);
      pQVar2 = (this->currentURL).d;
      (this->currentURL).d = (QUrlPrivate *)CONCAT44(RStack_94.m_i,local_98);
      local_98 = SUB84(pQVar2,0);
      RStack_94.m_i = (int)((ulong)pQVar2 >> 0x20);
      QUrl::~QUrl((QUrl *)local_98);
      bVar5 = true;
    }
    else {
      local_98 = SUB84(local_f8.d.size,0);
      RStack_94.m_i = (int)((ulong)local_f8.d.size >> 0x20);
      uStack_90._0_4_ = (Int)local_f8.d.ptr;
      uStack_90._4_4_ = (int)((ulong)local_f8.d.ptr >> 0x20);
      qVar14 = QStringView::indexOf((QStringView *)local_98,(QChar)0x3e,0,CaseSensitive);
      uVar18 = qVar14 + 1U;
      if ((ulong)qVar8 < qVar14 + 1U) {
        uVar18 = qVar8;
      }
      QVar26.m_data = pcVar7;
      QVar26.m_size = uVar18;
      QVar33.m_data = "<qt";
      QVar33.m_size = 3;
      cVar11 = QtPrivate::startsWith(QVar26,QVar33,CaseSensitive);
      if (cVar11 == '\0') goto LAB_004ae191;
      QVar27.m_data = pcVar7;
      QVar27.m_size = uVar18;
      QVar34.m_data = "type";
      QVar34.m_size = 4;
      lVar15 = QtPrivate::findString(QVar27,0,QVar34,CaseSensitive);
      if (lVar15 == -1) goto LAB_004ae191;
      QVar28.m_data = pcVar7;
      QVar28.m_size = uVar18;
      QVar35.m_data = "detail";
      QVar35.m_size = 6;
      lVar15 = QtPrivate::findString(QVar28,0,QVar35,CaseSensitive);
      if (lVar15 == -1) goto LAB_004ae191;
      QGuiApplication::restoreOverrideCursor();
      uVar16 = QCursor::pos();
      local_98 = SUB84(uVar16,0);
      RStack_94.m_i = (int)((ulong)uVar16 >> 0x20);
      QWhatsThis::showText((QPoint *)local_98,&local_f8,w);
      bVar5 = false;
    }
    ::QVariant::~QVariant((QVariant *)&local_58);
    if (!bVar5) goto LAB_004ae6f3;
  }
  cVar11 = QUrl::isValid();
  if (cVar11 == '\0') {
    QUrl::operator=(&this->home,url);
  }
  if (bVar5) {
    local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    QUrl::adjusted(&local_58,pQVar1,0x800);
    QUrl::path(local_98,&local_58,0x7f00000);
    piVar3 = (int *)CONCAT44(RStack_94.m_i,local_98);
    lVar15 = CONCAT44(uStack_84,local_88);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(RStack_94.m_i,local_98),2,0x10);
      }
    }
    if (lVar15 != 0) {
      pQVar17 = QTextEdit::document((QTextEdit *)w);
      QTextDocument::setBaseUrl((QUrl *)pQVar17);
    }
    pQVar17 = QTextEdit::document((QTextEdit *)w);
    QUrl::toString(local_98,pQVar1,0);
    QTextDocument::setMetaInformation((MetaInformation)pQVar17,(QString *)0x1);
    piVar3 = (int *)CONCAT44(RStack_94.m_i,local_98);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(RStack_94.m_i,local_98),2,0x10);
      }
    }
    if (lcBrowser()::category == '\0') {
      setSource();
    }
    if ((lcBrowser()::category[0x10] & 1) != 0) {
      local_98 = (undefined1  [4])0x2;
      RStack_94.m_i = 0;
      uStack_90._0_4_ = 0;
      uStack_90._4_4_ = 0;
      local_88 = 0;
      uStack_84 = 0;
      puStack_80 = (undefined1 *)lcBrowser()::category._8_8_;
      QMessageLogger::debug();
      QVar20.stream = local_178.stream;
      QVar29.m_data = (storage_type *)0x7;
      QVar29.m_size = (qsizetype)&local_d8;
      QString::fromUtf8(QVar29);
      QTextStream::operator<<((QTextStream *)QVar20.stream,(QString *)&local_d8);
      if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (*(QTextStream *)(local_178.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_178.stream,' ');
      }
      local_170.d = (QUrlPrivate *)local_178.stream;
      *(int *)(local_178.stream + 0x28) = *(int *)(local_178.stream + 0x28) + 1;
      ::operator<<((Stream *)&local_168,&local_170);
      QVar20.stream = local_168.stream;
      QVar30.m_data = (storage_type *)0x4;
      QVar30.m_size = (qsizetype)&local_d8;
      QString::fromUtf8(QVar30);
      QTextStream::operator<<((QTextStream *)QVar20.stream,(QString *)&local_d8);
      if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (*(QTextStream *)(local_168.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_168.stream,' ');
      }
      local_160.d = (QUrlPrivate *)local_168.stream;
      *(int *)(local_168.stream + 0x28) = *(int *)(local_168.stream + 0x28) + 1;
      QTextEdit::document((QTextEdit *)w);
      QTextDocument::baseUrl();
      ::operator<<((Stream *)&local_158,&local_160);
      QVar20.stream = local_158.stream;
      QVar31.m_data = (storage_type *)0x4;
      QVar31.m_size = (qsizetype)&local_d8;
      QString::fromUtf8(QVar31);
      QTextStream::operator<<((QTextStream *)QVar20.stream,(QString *)&local_d8);
      if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (*(QTextStream *)(local_158.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_158.stream,' ');
      }
      local_150.stream = local_158.stream;
      *(int *)(local_158.stream + 0x28) = *(int *)(local_158.stream + 0x28) + 1;
      qt_QMetaEnum_debugOperator
                (&local_148,(longlong)&local_150,(QMetaObject *)(ulong)type,
                 (char *)&QTextDocument::staticMetaObject);
      QTextStream::operator<<((QTextStream *)local_148.stream,local_f8.d.size);
      if ((char)(((QArrayData *)(local_148.stream + 0x30))->ref_)._q_value.super___atomic_base<int>.
                _M_i == '\x01') {
        QTextStream::operator<<((QTextStream *)local_148.stream,' ');
      }
      QVar20.stream = local_148.stream;
      QVar32.m_data = (storage_type *)0x5;
      QVar32.m_size = (qsizetype)&local_d8;
      QString::fromUtf8(QVar32);
      QTextStream::operator<<((QTextStream *)QVar20.stream,(QString *)&local_d8);
      if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((char)(((QArrayData *)(local_148.stream + 0x30))->ref_)._q_value.super___atomic_base<int>.
                _M_i == '\x01') {
        QTextStream::operator<<((QTextStream *)local_148.stream,' ');
      }
      QDebug::~QDebug(&local_148);
      QDebug::~QDebug(&local_150);
      QDebug::~QDebug(&local_158);
      QUrl::~QUrl(&local_180);
      QDebug::~QDebug((QDebug *)&local_160);
      QDebug::~QDebug(&local_168);
      QDebug::~QDebug((QDebug *)&local_170);
      QDebug::~QDebug(&local_178);
    }
    if (type == MarkdownResource) {
      QTextEdit::setMarkdown((QTextEdit *)w,&local_f8);
    }
    else {
      QTextEdit::setHtml((QTextEdit *)w,&local_f8);
    }
    QUrl::~QUrl((QUrl *)&local_58.shared);
  }
  this->forceLoadOnSourceChange = false;
  QUrl::fragment(local_98,url,0);
  piVar3 = (int *)CONCAT44(RStack_94.m_i,local_98);
  lVar15 = CONCAT44(uStack_84,local_88);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(RStack_94.m_i,local_98),2,0x10);
    }
  }
  if (lVar15 == 0) {
    QAbstractSlider::setValue
              (&((this->super_QTextEditPrivate).super_QAbstractScrollAreaPrivate.hbar)->
                super_QAbstractSlider,0);
    QAbstractSlider::setValue
              (&((this->super_QTextEditPrivate).super_QAbstractScrollAreaPrivate.vbar)->
                super_QAbstractSlider,0);
  }
  else {
    QUrl::fragment((QString *)local_98,url,0);
    QTextEdit::scrollToAnchor((QTextEdit *)w,(QString *)local_98);
    piVar3 = (int *)CONCAT44(RStack_94.m_i,local_98);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(RStack_94.m_i,local_98),2,0x10);
      }
    }
  }
  if ((w->data->widget_attributes & 0x8000) != 0) {
    QGuiApplication::restoreOverrideCursor();
  }
  local_98 = (undefined1  [4])0x0;
  RStack_94.m_i = 0;
  uStack_90 = url;
  QMetaObject::activate(&w->super_QObject,&QTextBrowser::staticMetaObject,3,(void **)local_98);
LAB_004ae6f3:
  piVar3 = (int *)CONCAT44(uStack_124,local_128);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(uStack_124,local_128),2,0x10);
    }
  }
  QUrl::~QUrl(&local_108);
  QUrl::~QUrl(&local_100);
  if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextBrowserPrivate::setSource(const QUrl &url, QTextDocument::ResourceType type)
{
    Q_Q(QTextBrowser);
#ifndef QT_NO_CURSOR
    if (q->isVisible())
        QGuiApplication::setOverrideCursor(Qt::WaitCursor);
#endif
    textOrSourceChanged = true;

    QString txt;

    bool doSetText = false;

    QUrl currentUrlWithoutFragment = currentURL;
    currentUrlWithoutFragment.setFragment(QString());
    QUrl newUrlWithoutFragment = currentURL.resolved(url);
    newUrlWithoutFragment.setFragment(QString());
    QString fileName = url.fileName();
    if (type == QTextDocument::UnknownResource) {
#if QT_CONFIG(textmarkdownreader)
        if (fileName.endsWith(".md"_L1) ||
                fileName.endsWith(".mkd"_L1) ||
                fileName.endsWith(".markdown"_L1))
            type = QTextDocument::MarkdownResource;
        else
#endif
            type = QTextDocument::HtmlResource;
    }
    currentType = type;

    if (url.isValid()
        && (newUrlWithoutFragment != currentUrlWithoutFragment || forceLoadOnSourceChange)) {
        QVariant data = q->loadResource(type, resolveUrl(url));
        if (data.userType() == QMetaType::QString) {
            txt = data.toString();
        } else if (data.userType() == QMetaType::QByteArray) {
            QByteArray ba = data.toByteArray();
            if (type == QTextDocument::HtmlResource) {
                auto decoder = QStringDecoder::decoderForHtml(ba);
                if (!decoder.isValid())
                    // fall back to utf8
                    decoder = QStringDecoder(QStringDecoder::Utf8);
                txt = decoder(ba);
            } else {
                txt = QString::fromUtf8(ba);
            }
        }
        if (Q_UNLIKELY(txt.isEmpty()))
            qWarning("QTextBrowser: No document for %s", url.toString().toLatin1().constData());

        if (q->isVisible()) {
            const QStringView firstTag = QStringView{txt}.left(txt.indexOf(u'>') + 1);
            if (firstTag.startsWith("<qt"_L1) && firstTag.contains("type"_L1) && firstTag.contains("detail"_L1)) {
#ifndef QT_NO_CURSOR
                QGuiApplication::restoreOverrideCursor();
#endif
#if QT_CONFIG(whatsthis)
                QWhatsThis::showText(QCursor::pos(), txt, q);
#endif
                return;
            }
        }

        currentURL = resolveUrl(url);
        doSetText = true;
    }

    if (!home.isValid())
        home = url;

    if (doSetText) {
        // Setting the base URL helps QTextDocument::resource() to find resources with relative paths.
        // But don't set it unless it contains the document's path, because QTextBrowserPrivate::resolveUrl()
        // can already deal with local files on the filesystem in case the base URL was not set.
        QUrl baseUrl = currentURL.adjusted(QUrl::RemoveFilename);
        if (!baseUrl.path().isEmpty())
            q->document()->setBaseUrl(baseUrl);
        q->document()->setMetaInformation(QTextDocument::DocumentUrl, currentURL.toString());
        qCDebug(lcBrowser) << "loading" << currentURL << "base" << q->document()->baseUrl() << "type" << type << txt.size() << "chars";
#if QT_CONFIG(textmarkdownreader)
        if (type == QTextDocument::MarkdownResource)
            q->QTextEdit::setMarkdown(txt);
        else
#endif
#ifndef QT_NO_TEXTHTMLPARSER
        q->QTextEdit::setHtml(txt);
#else
        q->QTextEdit::setPlainText(txt);
#endif

#ifdef QT_KEYPAD_NAVIGATION
        prevFocus.movePosition(QTextCursor::Start);
#endif
    }

    forceLoadOnSourceChange = false;

    if (!url.fragment().isEmpty()) {
        q->scrollToAnchor(url.fragment());
    } else {
        hbar->setValue(0);
        vbar->setValue(0);
    }
#ifdef QT_KEYPAD_NAVIGATION
    lastKeypadScrollValue = vbar->value();
    emitHighlighted(QUrl());
#endif

#ifndef QT_NO_CURSOR
    if (q->isVisible())
        QGuiApplication::restoreOverrideCursor();
#endif
    emit q->sourceChanged(url);
}